

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
baryonyx::details::pi_file_observer::make_observation<float>
          (pi_file_observer *this,sparse_matrix<int> *param_1,float *param_2,float *pi)

{
  bool bVar1;
  ostream *this_00;
  int local_2c;
  int i;
  float *pi_local;
  float *param_2_local;
  sparse_matrix<int> *param_1_local;
  pi_file_observer *this_local;
  
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(&this->m_ofs + *(long *)(*(long *)&this->m_ofs + -0x18)));
  if (bVar1) {
    if (this->m_len < 2) {
      std::ostream::operator<<(&this->m_ofs,*pi);
    }
    else {
      std::ostream::operator<<(&this->m_ofs,*pi);
      for (local_2c = 1; local_2c != this->constraints; local_2c = local_2c + 1) {
        this_00 = std::operator<<((ostream *)&this->m_ofs,' ');
        std::ostream::operator<<(this_00,pi[local_2c]);
      }
    }
    std::operator<<((ostream *)&this->m_ofs,'\n');
  }
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& /*ap*/,
                          const Float* /*P*/,
                          const Float* pi)
    {
        static_assert(std::is_floating_point<Float>::value);

        if (m_ofs) {
            if (m_len > 1) {
                m_ofs << pi[0];

                for (int i = 1; i != constraints; ++i)
                    m_ofs << ' ' << pi[i];

            } else {
                m_ofs << pi[0];
            }

            m_ofs << '\n';
        }
    }